

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

VRDatumPtr * __thiscall MinVR::VRDatumPtr::operator=(VRDatumPtr *this,VRDatumPtr *sp)

{
  VRDatum_conflict *pVVar1;
  VRDatumPtrRC *pVVar2;
  
  if (this != sp) {
    pVVar2 = this->reference;
    pVVar2->count = pVVar2->count + -1;
    if (pVVar2->count == 0) {
      pVVar1 = this->pData;
      if (pVVar1 != (VRDatum_conflict *)0x0) {
        (*pVVar1->_vptr_VRDatum[1])(pVVar1);
        pVVar2 = this->reference;
      }
      operator_delete(pVVar2,4);
    }
    this->pData = sp->pData;
    pVVar2 = sp->reference;
    this->reference = pVVar2;
    pVVar2->count = pVVar2->count + 1;
  }
  return this;
}

Assistant:

VRDatumPtr& operator = (const VRDatumPtr& sp)
  {
    // Assignment operator
    if (this != &sp) // Avoid self assignment
      {
        // Decrement the old reference count.  If references become
        // zero, delete the data.
        if(reference->release() == 0)
          {
            delete pData;
            delete reference;
          }

        // Copy the data and reference pointer and increment the
        // reference count
        pData = sp.pData;
        reference = sp.reference;
        reference->addRef();
      }
    return *this;
  }